

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProbabilityEval.cpp
# Opt level: O2

int32_t ProbMap::checkFd(string *ele,char base,string2int32 *fd_map)

{
  int32_t iVar1;
  const_iterator cVar2;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (ele,base);
  cVar2 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(fd_map,ele);
  if (cVar2.mKeyVals == (NodePtr)fd_map->mInfo) {
    iVar1 = 0;
  }
  else {
    iVar1 = ((cVar2.mKeyVals)->mData).second;
  }
  return iVar1;
}

Assistant:

int32_t ProbMap::checkFd(string ele, char base, const string2int32 &fd_map) {
    ele += base;
    auto res = fd_map.find(ele);
    if (res == fd_map.end()) {
        return 0;
    } else {
        return res->second;
    }
}